

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall
doctest::detail::MultiLaneAtomic<int>::operator=(MultiLaneAtomic<int> *this,int desired)

{
  int in_ESI;
  MultiLaneAtomic<int> *in_stack_00000018;
  
  store(in_stack_00000018,this._4_4_,(memory_order)this);
  return in_ESI;
}

Assistant:

T operator=(T desired) DOCTEST_NOEXCEPT { // lgtm [cpp/assignment-does-not-return-this]
            store(desired);
            return desired;
        }